

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O0

string * __thiscall
CoreML::FeatureType::toString_abi_cxx11_(string *__return_storage_ptr__,FeatureType *this)

{
  bool bVar1;
  ArrayFeatureType_ArrayDataType AVar2;
  KeyTypeCase KVar3;
  ImageFeatureType_ColorSpace IVar4;
  TypeCase TVar5;
  element_type *peVar6;
  ArrayFeatureType *this_00;
  size_type sVar7;
  ImageFeatureType *this_01;
  ostream *poVar8;
  SizeRange *pSVar9;
  CoreML *this_02;
  int64 min;
  undefined1 useArrayFormat;
  TypeCase tag_00;
  ArrayFeatureType_ArrayDataType dataType;
  KeyTypeCase tag_01;
  TypeCase tag_02;
  ImageFeatureType_ColorSpace colorspace;
  TypeCase seqType;
  char *__rhs;
  undefined1 in_R8B;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  string local_328;
  string local_308;
  SequenceFeatureType *local_2e8;
  SequenceFeatureType *params_3;
  undefined1 local_2c0 [8];
  vector<long,_std::allocator<long>_> size;
  ImageFeatureType *params_2;
  string local_260;
  DictionaryFeatureType *local_240;
  DictionaryFeatureType *params_1;
  undefined1 local_218 [8];
  vector<long,_std::allocator<long>_> shape;
  ArrayFeatureType *params;
  TypeCase local_1a4;
  stringstream local_1a0 [4];
  TypeCase tag;
  stringstream ss;
  ostream local_190 [376];
  FeatureType *local_18;
  FeatureType *this_local;
  
  local_18 = this;
  this_local = (FeatureType *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  peVar6 = std::
           __shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  local_1a4 = Specification::FeatureType::Type_case(peVar6);
  featureTypeToString_abi_cxx11_((string *)&params,(CoreML *)(ulong)local_1a4,tag_00);
  std::operator<<(local_190,(string *)&params);
  std::__cxx11::string::~string((string *)&params);
  useArrayFormat = 0x30;
  switch(local_1a4) {
  case kImageType:
    peVar6 = std::
             __shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    this_01 = Specification::FeatureType::imagetype(peVar6);
    std::operator<<(local_190," (");
    IVar4 = Specification::ImageFeatureType::colorspace(this_01);
    colorSpaceToString_abi_cxx11_
              ((string *)
               &size.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,(CoreML *)(ulong)(uint)IVar4,colorspace);
    std::operator<<(local_190,
                    (string *)
                    &size.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &size.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    defaultSizeOf((vector<long,_std::allocator<long>_> *)local_2c0,this_01);
    sVar7 = std::vector<long,_std::allocator<long>_>::size
                      ((vector<long,_std::allocator<long>_> *)local_2c0);
    if (sVar7 != 0) {
      std::operator<<(local_190," ");
      dimensionsToString_abi_cxx11_
                ((string *)&params_3,(CoreML *)local_2c0,(vector<long,_std::allocator<long>_> *)0x0,
                 (bool)useArrayFormat);
      std::operator<<(local_190,(string *)&params_3);
      std::__cxx11::string::~string((string *)&params_3);
    }
    std::operator<<(local_190,")");
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)local_2c0);
    break;
  case kMultiArrayType:
    peVar6 = std::
             __shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    this_00 = Specification::FeatureType::multiarraytype(peVar6);
    poVar8 = std::operator<<(local_190," (");
    AVar2 = Specification::ArrayFeatureType::datatype(this_00);
    dataTypeToString_abi_cxx11_
              ((string *)
               &shape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(CoreML *)(ulong)(uint)AVar2,dataType);
    std::operator<<(poVar8,(string *)
                           &shape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &shape.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    defaultShapeOf((vector<long,_std::allocator<long>_> *)local_218,this_00);
    sVar7 = std::vector<long,_std::allocator<long>_>::size
                      ((vector<long,_std::allocator<long>_> *)local_218);
    if (sVar7 != 0) {
      std::operator<<(local_190," ");
      dimensionsToString_abi_cxx11_
                ((string *)&params_1,(CoreML *)local_218,(vector<long,_std::allocator<long>_> *)0x0,
                 (bool)useArrayFormat);
      std::operator<<(local_190,(string *)&params_1);
      std::__cxx11::string::~string((string *)&params_1);
    }
    std::operator<<(local_190,")");
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)local_218);
    break;
  case kDictionaryType:
    peVar6 = std::
             __shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_240 = Specification::FeatureType::dictionarytype(peVar6);
    std::operator<<(local_190," (");
    KVar3 = Specification::DictionaryFeatureType::KeyType_case(local_240);
    keyTypeToString_abi_cxx11_(&local_260,(CoreML *)(ulong)KVar3,tag_01);
    std::operator<<(local_190,(string *)&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::operator<<(local_190,anon_var_dwarf_2db0c4);
    featureTypeToString_abi_cxx11_((string *)&params_2,(CoreML *)0x2,tag_02);
    std::operator<<(local_190,(string *)&params_2);
    std::__cxx11::string::~string((string *)&params_2);
    std::operator<<(local_190,")");
    break;
  case kSequenceType:
    peVar6 = std::
             __shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_2e8 = Specification::FeatureType::sequencetype(peVar6);
    std::operator<<(local_190," (");
    TVar5 = Specification::SequenceFeatureType::Type_case(local_2e8);
    sequenceTypeToString_abi_cxx11_(&local_308,(CoreML *)(ulong)TVar5,seqType);
    std::operator<<(local_190,(string *)&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    poVar8 = std::operator<<(local_190," ");
    pSVar9 = Specification::SequenceFeatureType::sizerange(local_2e8);
    this_02 = (CoreML *)Specification::SizeRange::lowerbound(pSVar9);
    pSVar9 = Specification::SequenceFeatureType::sizerange(local_2e8);
    min = Specification::SizeRange::upperbound(pSVar9);
    rangeToString_abi_cxx11_(&local_328,this_02,min,0,(bool)in_R8B);
    std::operator<<(poVar8,(string *)&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::operator<<(local_190,")");
  }
  std::__cxx11::stringstream::str();
  peVar6 = std::
           __shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  bVar1 = Specification::FeatureType::isoptional(peVar6);
  __rhs = "";
  if (bVar1) {
    __rhs = "?";
  }
  std::operator+(__return_storage_ptr__,&local_348,__rhs);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string FeatureType::toString() const {
        std::stringstream ss;
        Specification::FeatureType::TypeCase tag = m_type->Type_case();

        ss << featureTypeToString(tag);

        switch (tag) {
            case Specification::FeatureType::kMultiArrayType:
            {
                const Specification::ArrayFeatureType& params = m_type->multiarraytype();
                ss << " (" << dataTypeToString(params.datatype());
                std::vector<int64_t> shape = defaultShapeOf(params);
                if (shape.size() > 0) {
                    ss << " ";
                    ss << dimensionsToString(shape);
                }
                ss << ")";
                break;
            }
            case Specification::FeatureType::kDictionaryType:
            {
                const Specification::DictionaryFeatureType& params = m_type->dictionarytype();
                ss << " (";
                ss << keyTypeToString(params.KeyType_case());
                ss << " → ";
                ss << featureTypeToString(Specification::FeatureType::kDoubleType); // assume double value
                ss << ")";
                break;
            }
            case Specification::FeatureType::kImageType:
            {
                const Specification::ImageFeatureType& params = m_type->imagetype();
                ss << " (";
                ss << colorSpaceToString(params.colorspace());
                std::vector<int64_t> size = defaultSizeOf(params);
                if (size.size() > 0) {
                    ss << " ";
                    ss << dimensionsToString(size);
                }
                ss << ")";
                break;
            }
            case Specification::FeatureType::kSequenceType:
            {
                const Specification::SequenceFeatureType& params = m_type->sequencetype();
                ss << " (";
                ss << sequenceTypeToString(params.Type_case());
                ss << " " << rangeToString((int64_t)params.sizerange().lowerbound(),params.sizerange().upperbound());
                ss << ")";
                break;
            }
            default:
                break;
        }
        return ss.str() + (m_type->isoptional() ? "?" : "");
    }